

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O3

void __thiscall GenericModelItem::insertRows(GenericModelItem *this,int row,int count)

{
  if (0 < this->m_colCount) {
    insertRows();
  }
  this->m_rowCount = this->m_rowCount + count;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, int count)
{
    if (m_colCount > 0) {
        for (auto i = children.begin() + (row * m_colCount), iEnd = children.end(); i != iEnd; ++i)
            (*i)->m_row += count;
        children.insert(row * m_colCount, count * m_colCount, nullptr);
        for (int i = row * m_colCount; i < (row + count) * m_colCount; ++i) {
            auto newChild = new GenericModelItem(this);
            newChild->m_column = i % m_colCount;
            newChild->m_row = i / m_colCount;
            children[i] = newChild;
        }
    }
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}